

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O0

void * mwMark(void *p,char *desc,char *file,uint line)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  char *__dest;
  char local_d8 [8];
  char wherebuf [128];
  int oflow;
  int tot;
  char *buf;
  uint isnew;
  uint n;
  mwMarker *mrk;
  char *pcStack_28;
  uint line_local;
  char *file_local;
  char *desc_local;
  void *p_local;
  
  mwAutoInit();
  if (mwTestAlways != 0) {
    mwTestNow((char *)0x0,0,1);
  }
  file_local = desc;
  if (desc == (char *)0x0) {
    file_local = "unknown";
  }
  pcStack_28 = file;
  if (file == (char *)0x0) {
    pcStack_28 = "unknown";
  }
  iVar2 = sprintf(local_d8,"%.48s called from %s(%d)",file_local,pcStack_28,(ulong)line);
  if (0x7f < iVar2) {
    wherebuf[0x77] = '\0';
  }
  if (p == (void *)0x0) {
    mwWrite("mark: %s(%d), no mark for NULL:\'%s\' may be set\n",pcStack_28,(ulong)line,file_local);
  }
  else if ((mwFirstMark == (mwMarker *)0x0) || (iVar3 = mwIsReadAddr(mwFirstMark,0x20), iVar3 != 0))
  {
    for (_isnew = mwFirstMark; _isnew != (mwMarker *)0x0; _isnew = _isnew->next) {
      if ((_isnew->next != (mwMarker *)0x0) && (iVar3 = mwIsReadAddr(_isnew->next,0x20), iVar3 == 0)
         ) {
        mwWrite("mark: %s(%d), mark(%p)->next(%p) is trashed, can\'t mark for %s\n",pcStack_28,
                (ulong)line,_isnew,_isnew->next,file_local);
        return p;
      }
      if (_isnew->host == p) break;
    }
    if (_isnew == (mwMarker *)0x0) {
      bVar1 = true;
      _isnew = (mwMarker *)malloc(0x20);
      if (_isnew == (mwMarker *)0x0) {
        mwWrite("mark: %s(%d), no mark for %p:\'%s\', out of memory\n",pcStack_28,(ulong)line,p,
                file_local);
        return p;
      }
      _isnew->next = (mwMarker *)0x0;
      buf._4_4_ = 0;
    }
    else {
      bVar1 = false;
      sVar4 = strlen(_isnew->text);
      buf._4_4_ = (int)sVar4;
    }
    sVar4 = strlen(local_d8);
    iVar3 = buf._4_4_ + (int)sVar4;
    __dest = (char *)malloc((ulong)(iVar3 + 3));
    if (__dest == (char *)0x0) {
      if (bVar1) {
        free(_isnew);
      }
      mwWrite("mark: %s(%d), no mark for %p:\'%s\', out of memory\n",pcStack_28,(ulong)line,p,
              file_local);
    }
    else {
      if (bVar1) {
        memcpy(__dest,local_d8,(ulong)(iVar3 + 1));
        _isnew->next = mwFirstMark;
        _isnew->host = p;
        _isnew->text = __dest;
        _isnew->level = 1;
        mwFirstMark = _isnew;
      }
      else {
        strcpy(__dest,_isnew->text);
        strcat(__dest,", ");
        strcat(__dest,local_d8);
        free(_isnew->text);
        _isnew->text = __dest;
        _isnew->level = _isnew->level + 1;
      }
      if (0x7f < iVar2) {
        mwIncErr();
        mwTrace(" [WARNING: OUTPUT BUFFER OVERFLOW - SYSTEM UNSTABLE]\n");
      }
    }
  }
  else {
    mwWrite("mark: %s(%d), mwFirstMark (%p) is trashed, can\'t mark for %s\n",pcStack_28,(ulong)line
            ,mwFirstMark,file_local);
  }
  return p;
}

Assistant:

void *mwMark(void *p, const char *desc, const char *file, unsigned line)
{
	mwMarker *mrk;
	unsigned n, isnew;
	char *buf;
	int tot, oflow = 0;
	char wherebuf[128];

	mwAutoInit();
	TESTS(NULL, 0);

	if (desc == NULL) {
		desc = "unknown";
	}
	if (file == NULL) {
		file = "unknown";
	}

	tot = sprintf(wherebuf, "%.48s called from %s(%d)", desc, file, line);
	if (tot >= (int)sizeof(wherebuf)) {
		wherebuf[sizeof(wherebuf) - 1] = 0;
		oflow = 1;
	}

	if (p == NULL) {
		mwWrite("mark: %s(%d), no mark for NULL:'%s' may be set\n", file, line, desc);
		return p;
	}

	if (mwFirstMark != NULL && !mwIsReadAddr(mwFirstMark, sizeof(mwMarker))) {
		mwWrite("mark: %s(%d), mwFirstMark (%p) is trashed, can't mark for %s\n",
				file, line, mwFirstMark, desc);
		return p;
	}

	for (mrk = mwFirstMark; mrk; mrk = mrk->next) {
		if (mrk->next != NULL && !mwIsReadAddr(mrk->next, sizeof(mwMarker))) {
			mwWrite("mark: %s(%d), mark(%p)->next(%p) is trashed, can't mark for %s\n",
					file, line, mrk, mrk->next, desc);
			return p;
		}
		if (mrk->host == p) {
			break;
		}
	}

	if (mrk == NULL) {
		isnew = 1;
		mrk = (mwMarker *) malloc(sizeof(mwMarker));
		if (mrk == NULL) {
			mwWrite("mark: %s(%d), no mark for %p:'%s', out of memory\n", file, line, p, desc);
			return p;
		}
		mrk->next = NULL;
		n = 0;
	} else {
		isnew = 0;
		n = strlen(mrk->text);
	}

	n += strlen(wherebuf);
	buf = (char *) malloc(n + 3);
	if (buf == NULL) {
		if (isnew) {
			free(mrk);
		}
		mwWrite("mark: %s(%d), no mark for %p:'%s', out of memory\n", file, line, p, desc);
		return p;
	}

	if (isnew) {
		memcpy(buf, wherebuf, n + 1);
		mrk->next = mwFirstMark;
		mrk->host = p;
		mrk->text = buf;
		mrk->level = 1;
		mwFirstMark = mrk;
	} else {
		strcpy(buf, mrk->text);
		strcat(buf, ", ");
		strcat(buf, wherebuf);
		free(mrk->text);
		mrk->text = buf;
		mrk->level ++;
	}

	if (oflow) {
		mwIncErr();
		mwTrace(" [WARNING: OUTPUT BUFFER OVERFLOW - SYSTEM UNSTABLE]\n");
	}
	return p;
}